

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

TRANSFER_HANDLE transfer_clone(TRANSFER_HANDLE value)

{
  TRANSFER_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (TRANSFER_HANDLE)malloc(8);
  if (__ptr != (TRANSFER_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (TRANSFER_HANDLE)0x0;
}

Assistant:

TRANSFER_HANDLE transfer_clone(TRANSFER_HANDLE value)
{
    TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)malloc(sizeof(TRANSFER_INSTANCE));
    if (transfer_instance != NULL)
    {
        transfer_instance->composite_value = amqpvalue_clone(((TRANSFER_INSTANCE*)value)->composite_value);
        if (transfer_instance->composite_value == NULL)
        {
            free(transfer_instance);
            transfer_instance = NULL;
        }
    }

    return transfer_instance;
}